

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O2

int canvas_readscalar(_glist *x,int natoms,t_atom *vec,int *p_nextmsg,int selectit)

{
  int iVar1;
  uint uVar2;
  t_symbol *s;
  t_template *ptVar3;
  _glist *x_00;
  _glist *p_Var4;
  _glist *x_01;
  char *pcVar5;
  int iVar6;
  char *fmt;
  int message;
  t_symbol *local_38;
  
  iVar6 = *p_nextmsg;
  iVar1 = glist_isvisible(x);
  if (iVar6 < natoms) {
    if (vec[iVar6].a_type == A_SYMBOL) {
      s = canvas_makebindsym(vec[iVar6].a_w.w_symbol);
      *p_nextmsg = iVar6 + 1;
      ptVar3 = template_findbyname(s);
      if (ptVar3 == (t_template *)0x0) {
        pcVar5 = s->s_name;
        fmt = "canvas_read: %s: no such template";
      }
      else {
        x_00 = (_glist *)scalar_new(x,s);
        if (x_00 != (_glist *)0x0) {
          iVar6 = (int)vec;
          local_38 = s;
          if (iVar1 == 0) {
            glist_add(x,(t_gobj *)x_00);
            uVar2 = canvas_scanbinbuf(natoms,vec,&message,p_nextmsg);
            glist_readatoms((_glist *)(ulong)(uint)natoms,iVar6,(t_atom *)p_nextmsg,(int *)local_38,
                            (t_symbol *)&(x_00->gl_obj).te_outlet,(t_word *)(ulong)uVar2,
                            message * 0x10 + iVar6,(t_atom *)CONCAT44(message,selectit));
          }
          else {
            p_Var4 = glist_getcanvas(x_00);
            p_Var4->field_0xe8 = p_Var4->field_0xe8 & 0xfd;
            glist_add(x,(t_gobj *)x_00);
            uVar2 = canvas_scanbinbuf(natoms,vec,&message,p_nextmsg);
            glist_readatoms((_glist *)(ulong)(uint)natoms,iVar6,(t_atom *)p_nextmsg,(int *)local_38,
                            (t_symbol *)&(x_00->gl_obj).te_outlet,(t_word *)(ulong)uVar2,
                            message * 0x10 + iVar6,(t_atom *)CONCAT44(message,selectit));
            p_Var4 = glist_getcanvas(x_01);
            p_Var4->field_0xe8 = p_Var4->field_0xe8 | 2;
            gobj_vis((t_gobj *)x_00,x,1);
          }
          if (selectit == 0) {
            return 1;
          }
          glist_select(x,(t_gobj *)x_00);
          return 1;
        }
        pcVar5 = s->s_name;
        fmt = "couldn\'t create scalar \"%s\"";
      }
      pd_error((void *)0x0,fmt,pcVar5);
      *p_nextmsg = natoms;
      return 0;
    }
    post("stopping early: type %d");
  }
  *p_nextmsg = natoms;
  return 0;
}

Assistant:

int canvas_readscalar(t_glist *x, int natoms, t_atom *vec,
    int *p_nextmsg, int selectit)
{
    int message, nline;
    t_template *template;
    t_symbol *templatesym;
    t_scalar *sc;
    int nextmsg = *p_nextmsg;
    int wasvis = glist_isvisible(x);

    if (nextmsg >= natoms || vec[nextmsg].a_type != A_SYMBOL)
    {
        if (nextmsg < natoms)
            post("stopping early: type %d", vec[nextmsg].a_type);
        *p_nextmsg = natoms;
        return (0);
    }
    templatesym = canvas_makebindsym(vec[nextmsg].a_w.w_symbol);
    *p_nextmsg = nextmsg + 1;

    if (!(template = template_findbyname(templatesym)))
    {
        pd_error(0, "canvas_read: %s: no such template", templatesym->s_name);
        *p_nextmsg = natoms;
        return (0);
    }
    sc = scalar_new(x, templatesym);
    if (!sc)
    {
        pd_error(0, "couldn't create scalar \"%s\"", templatesym->s_name);
        *p_nextmsg = natoms;
        return (0);
    }
    if (wasvis)
    {
            /* temporarily lie about vis flag while this is built */
        glist_getcanvas(x)->gl_mapped = 0;
    }
    glist_add(x, &sc->sc_gobj);

    nline = canvas_scanbinbuf(natoms, vec, &message, p_nextmsg);
    glist_readatoms(x, natoms, vec, p_nextmsg, templatesym, sc->sc_vec,
        nline, vec + message);
    if (wasvis)
    {
            /* reset vis flag as before */
        glist_getcanvas(x)->gl_mapped = 1;
        gobj_vis(&sc->sc_gobj, x, 1);
    }
    if (selectit)
    {
        glist_select(x, &sc->sc_gobj);
    }
    return (1);
}